

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O0

int bio_read_all(BIO *bio,uint8_t **out,size_t *out_len,uint8_t *prefix,size_t prefix_len,
                size_t max_len)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *new_buf;
  ulong uStack_58;
  int n;
  size_t todo;
  size_t done;
  size_t len;
  size_t max_len_local;
  size_t prefix_len_local;
  uint8_t *prefix_local;
  size_t *out_len_local;
  uint8_t **out_local;
  BIO *bio_local;
  
  done = prefix_len + 0x1000;
  if (max_len < done) {
    done = max_len;
  }
  if (prefix_len <= done) {
    puVar2 = (uint8_t *)OPENSSL_malloc(done);
    *out = puVar2;
    if (*out != (uint8_t *)0x0) {
      OPENSSL_memcpy(*out,prefix,prefix_len);
      todo = prefix_len;
      while (todo != done) {
        uStack_58 = done - todo;
        if (0x7fffffff < uStack_58) {
          uStack_58 = 0x7fffffff;
        }
        iVar1 = BIO_read((BIO *)bio,*out + todo,(int)uStack_58);
        if (iVar1 == 0) {
          *out_len = todo;
          return 1;
        }
        if (iVar1 == -1) {
          OPENSSL_free(*out);
          return 0;
        }
        todo = (long)iVar1 + todo;
        if ((done < max_len) && (done - todo < 0x800)) {
          done = done + 0x1000;
          if ((done < 0x1000) || (max_len < done)) {
            done = max_len;
          }
          puVar2 = (uint8_t *)OPENSSL_realloc(*out,done);
          if (puVar2 == (uint8_t *)0x0) {
            OPENSSL_free(*out);
            return 0;
          }
          *out = puVar2;
        }
      }
      OPENSSL_free(*out);
    }
  }
  return 0;
}

Assistant:

static int bio_read_all(BIO *bio, uint8_t **out, size_t *out_len,
                        const uint8_t *prefix, size_t prefix_len,
                        size_t max_len) {
  static const size_t kChunkSize = 4096;

  size_t len = prefix_len + kChunkSize;
  if (len > max_len) {
    len = max_len;
  }
  if (len < prefix_len) {
    return 0;
  }
  *out = reinterpret_cast<uint8_t *>(OPENSSL_malloc(len));
  if (*out == NULL) {
    return 0;
  }
  OPENSSL_memcpy(*out, prefix, prefix_len);
  size_t done = prefix_len;

  for (;;) {
    if (done == len) {
      OPENSSL_free(*out);
      return 0;
    }
    size_t todo = len - done;
    if (todo > INT_MAX) {
      todo = INT_MAX;
    }
    const int n = BIO_read(bio, *out + done, (int)todo);
    if (n == 0) {
      *out_len = done;
      return 1;
    } else if (n == -1) {
      OPENSSL_free(*out);
      return 0;
    }

    done += n;
    if (len < max_len && len - done < kChunkSize / 2) {
      len += kChunkSize;
      if (len < kChunkSize || len > max_len) {
        len = max_len;
      }
      uint8_t *new_buf =
          reinterpret_cast<uint8_t *>(OPENSSL_realloc(*out, len));
      if (new_buf == NULL) {
        OPENSSL_free(*out);
        return 0;
      }
      *out = new_buf;
    }
  }
}